

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

void __thiscall t_js_generator::generate_const(t_js_generator *this,t_const *tconst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_type *type;
  pointer pcVar2;
  t_const_value *value;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  string name;
  string local_d0;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  char *local_90;
  long local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  type = tconst->type_;
  local_b0 = local_a0;
  pcVar2 = (tconst->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (tconst->name_)._M_string_length);
  value = tconst->value_;
  js_type_namespace_abi_cxx11_
            (&local_d0,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_,local_d0._M_dataplus._M_p,local_d0._M_string_length
                     );
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  render_const_value_abi_cxx11_(&local_d0,this,type,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_,local_d0._M_dataplus._M_p,local_d0._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (this->gen_ts_ == true) {
    ts_print_doc_abi_cxx11_(&local_d0,this,&tconst->super_t_doc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_types_ts_,local_d0._M_dataplus._M_p,
                        local_d0._M_string_length);
    ts_indent_abi_cxx11_(&local_50,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    pcVar5 = "export declare ";
    if ((this->gen_node_ & 1U) != 0) {
      pcVar5 = "declare ";
    }
    __s = "";
    if ((this->ts_module_)._M_string_length == 0) {
      __s = pcVar5;
    }
    local_90 = local_80;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_90,local_88);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->js_const_type_)._M_dataplus._M_p,
                        (this->js_const_type_)._M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    ts_get_type_abi_cxx11_(&local_70,this,type);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void t_js_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_types_ << js_type_namespace(program_) << name << " = ";
  f_types_ << render_const_value(type, value) << ";" << endl;

  if (gen_ts_) {
    f_types_ts_ << ts_print_doc(tconst) << ts_indent() << ts_declare() << js_const_type_ << name << ": "
                << ts_get_type(type) << ";" << endl;
  }
}